

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCtorsPass.cpp
# Opt level: O1

PreservedAnalyses * __thiscall
InlineCtorsPass::run
          (PreservedAnalyses *__return_storage_ptr__,InlineCtorsPass *this,Function *F,
          FunctionAnalysisManager *FM)

{
  void **ppvVar1;
  void **ppvVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 *puVar7;
  void *pvVar8;
  uint uVar9;
  ulong *puVar10;
  char cVar11;
  GlobalVariable *Tors;
  GlobalVariable *Tors_00;
  FunctionType *pFVar12;
  ulong uVar13;
  Function *pFVar14;
  Function *pFVar15;
  ulong *puVar16;
  Function *pFVar17;
  ulong *puVar18;
  pair<llvm::Function_*,_unsigned_long> *__i;
  ulong *puVar19;
  long lVar20;
  Twine *NameStr;
  ulong *puVar21;
  long lVar22;
  Function *pFVar23;
  StringRef SVar24;
  StringRef SVar25;
  StringRef SVar26;
  SmallVector<std::pair<llvm::Function_*,_unsigned_long>,_4U> Ctors;
  SmallVector<std::pair<llvm::Function_*,_unsigned_long>,_4U> Dtors;
  Instruction *in_stack_fffffffffffffec8;
  SmallVectorImpl<std::pair<llvm::Function_*,_unsigned_long>_> local_f8;
  undefined1 local_e8 [64];
  SmallVectorImpl<std::pair<llvm::Function_*,_unsigned_long>_> local_a8;
  undefined1 local_98 [64];
  Twine local_58;
  InlineCtorsPass *this_00;
  
  SVar24.Length = (size_t)"shellvm-main";
  SVar24.Data = (char *)F;
  cVar11 = llvm::Function::hasFnAttribute(SVar24);
  if (cVar11 != '\0') {
    SVar25.Length = (size_t)"llvm.global_ctors";
    SVar25.Data = *(char **)(F + 0x28);
    Tors = (GlobalVariable *)llvm::Module::getGlobalVariable(SVar25,true);
    this_00 = *(InlineCtorsPass **)(F + 0x28);
    SVar26.Length = (size_t)"llvm.global_dtors";
    SVar26.Data = (char *)this_00;
    Tors_00 = (GlobalVariable *)llvm::Module::getGlobalVariable(SVar26,true);
    if (Tors != (GlobalVariable *)0x0 || Tors_00 != (GlobalVariable *)0x0) {
      local_f8.super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
      super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>.
      super_SmallVectorBase<unsigned_int>.BeginX = local_e8;
      local_f8.super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
      super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>.
      super_SmallVectorBase<unsigned_int>.Size = 0;
      local_f8.super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
      super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>.
      super_SmallVectorBase<unsigned_int>.Capacity = 4;
      getFunctions(this_00,Tors,&local_f8);
      local_a8.super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
      super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>.
      super_SmallVectorBase<unsigned_int>.BeginX = local_98;
      local_a8.super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
      super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>.
      super_SmallVectorBase<unsigned_int>.Size = 0;
      local_a8.super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
      super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>.
      super_SmallVectorBase<unsigned_int>.Capacity = 4;
      getFunctions(this_00,Tors_00,&local_a8);
      pvVar8 = local_f8.
               super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
               super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>.
               super_SmallVectorBase<unsigned_int>.BeginX;
      uVar9 = local_f8.
              super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
              super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>.
              super_SmallVectorBase<unsigned_int>.Size;
      uVar13 = local_f8.
               super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
               super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>.
               super_SmallVectorBase<unsigned_int>._8_8_ & 0xffffffff;
      if (uVar13 != 0) {
        puVar21 = (ulong *)((long)local_f8.
                                  super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>
                                  .
                                  super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>
                                  .super_SmallVectorBase<unsigned_int>.BeginX + uVar13 * 0x10);
        lVar22 = 0x3f;
        if (uVar13 != 0) {
          for (; local_f8.
                 super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
                 super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>.
                 super_SmallVectorBase<unsigned_int>.Size >> lVar22 == 0; lVar22 = lVar22 + -1) {
          }
        }
        std::
        __introsort_loop<std::pair<llvm::Function*,unsigned_long>*,long,__gnu_cxx::__ops::_Iter_comp_iter<InlineCtorsPass::run(llvm::Function&,llvm::AnalysisManager<llvm::Function>&)::__0>>
                  (local_f8.
                   super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
                   super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>
                   .super_SmallVectorBase<unsigned_int>.BeginX,puVar21,
                   ((uint)lVar22 ^ 0x3f) * 2 ^ 0x7e);
        if (uVar9 < 0x11) {
          std::
          __insertion_sort<std::pair<llvm::Function*,unsigned_long>*,__gnu_cxx::__ops::_Iter_comp_iter<InlineCtorsPass::run(llvm::Function&,llvm::AnalysisManager<llvm::Function>&)::__0>>
                    (pvVar8,puVar21);
        }
        else {
          puVar19 = (ulong *)((long)pvVar8 + 0x100);
          std::
          __insertion_sort<std::pair<llvm::Function*,unsigned_long>*,__gnu_cxx::__ops::_Iter_comp_iter<InlineCtorsPass::run(llvm::Function&,llvm::AnalysisManager<llvm::Function>&)::__0>>
                    (pvVar8,puVar19);
          puVar18 = (ulong *)((long)pvVar8 + 0x108);
          do {
            uVar13 = puVar19[-1];
            uVar3 = *puVar19;
            uVar4 = puVar19[1];
            puVar16 = puVar19;
            puVar10 = puVar18;
            if (uVar13 < uVar4) {
              do {
                puVar16 = puVar10;
                puVar16[-1] = puVar16[-3];
                *puVar16 = uVar13;
                puVar10 = puVar16 + -2;
                uVar13 = puVar16[-4];
              } while (puVar16[-4] < uVar4);
              puVar16 = puVar16 + -3;
            }
            *puVar16 = uVar3;
            puVar16[1] = uVar4;
            puVar19 = puVar19 + 2;
            puVar18 = puVar18 + 2;
          } while (puVar19 != puVar21);
        }
      }
      pvVar8 = local_f8.
               super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
               super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>.
               super_SmallVectorBase<unsigned_int>.BeginX;
      uVar9 = local_f8.
              super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
              super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>.
              super_SmallVectorBase<unsigned_int>.Size;
      uVar13 = local_f8.
               super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
               super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>.
               super_SmallVectorBase<unsigned_int>._8_8_ & 0xffffffff;
      if (uVar13 != 0) {
        puVar21 = (ulong *)((long)local_f8.
                                  super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>
                                  .
                                  super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>
                                  .super_SmallVectorBase<unsigned_int>.BeginX + uVar13 * 0x10);
        lVar22 = 0x3f;
        if (uVar13 != 0) {
          for (; local_f8.
                 super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
                 super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>.
                 super_SmallVectorBase<unsigned_int>.Size >> lVar22 == 0; lVar22 = lVar22 + -1) {
          }
        }
        std::
        __introsort_loop<std::pair<llvm::Function*,unsigned_long>*,long,__gnu_cxx::__ops::_Iter_comp_iter<InlineCtorsPass::run(llvm::Function&,llvm::AnalysisManager<llvm::Function>&)::__1>>
                  (local_f8.
                   super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
                   super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>
                   .super_SmallVectorBase<unsigned_int>.BeginX,puVar21,
                   ((uint)lVar22 ^ 0x3f) * 2 ^ 0x7e);
        if (uVar9 < 0x11) {
          std::
          __insertion_sort<std::pair<llvm::Function*,unsigned_long>*,__gnu_cxx::__ops::_Iter_comp_iter<InlineCtorsPass::run(llvm::Function&,llvm::AnalysisManager<llvm::Function>&)::__1>>
                    (pvVar8,puVar21);
        }
        else {
          puVar19 = (ulong *)((long)pvVar8 + 0x100);
          std::
          __insertion_sort<std::pair<llvm::Function*,unsigned_long>*,__gnu_cxx::__ops::_Iter_comp_iter<InlineCtorsPass::run(llvm::Function&,llvm::AnalysisManager<llvm::Function>&)::__1>>
                    (pvVar8,puVar19);
          puVar18 = (ulong *)((long)pvVar8 + 0x108);
          do {
            uVar13 = puVar19[-1];
            uVar3 = *puVar19;
            uVar4 = puVar19[1];
            puVar16 = puVar19;
            puVar10 = puVar18;
            if (uVar4 < uVar13) {
              do {
                puVar16 = puVar10;
                puVar16[-1] = puVar16[-3];
                *puVar16 = uVar13;
                puVar10 = puVar16 + -2;
                uVar13 = puVar16[-4];
              } while (uVar4 < puVar16[-4]);
              puVar16 = puVar16 + -3;
            }
            *puVar16 = uVar3;
            puVar16[1] = uVar4;
            puVar19 = puVar19 + 2;
            puVar18 = puVar18 + 2;
          } while (puVar19 != puVar21);
        }
      }
      pvVar8 = local_f8.
               super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
               super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>.
               super_SmallVectorBase<unsigned_int>.BeginX;
      lVar22 = *(long *)(F + 0x50) + -0x18;
      if (*(long *)(F + 0x50) == 0) {
        lVar22 = 0;
      }
      lVar22 = *(long *)(lVar22 + 0x30);
      while( true ) {
        if (lVar22 == 0) {
          __assert_fail("Val && \"isa<> used on a null pointer\"",
                        "/usr/lib/llvm-14/include/llvm/Support/Casting.h",0x5a,
                        "static bool llvm::isa_impl_cl<llvm::AllocaInst, llvm::Instruction *>::doit(const From *) [To = llvm::AllocaInst, From = llvm::Instruction *]"
                       );
        }
        if (*(char *)(lVar22 + -8) != ':') break;
        lVar22 = *(long *)(lVar22 + 8);
      }
      uVar13 = local_f8.
               super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
               super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>.
               super_SmallVectorBase<unsigned_int>._8_8_ & 0xffffffff;
      if (uVar13 != 0) {
        lVar20 = 0;
        do {
          pFVar23 = *(Function **)((long)pvVar8 + lVar20);
          if (pFVar23 == (Function *)0x0) {
            pFVar12 = (FunctionType *)0x0;
          }
          else {
            pFVar12 = llvm::Function::getFunctionType(pFVar23);
          }
          llvm::Twine::Twine(&local_58,"");
          auVar5._8_8_ = 0;
          auVar5._0_8_ = &local_58;
          llvm::CallInst::Create
                    ((CallInst *)pFVar12,(FunctionType *)pFVar23,(Value *)0x0,
                     (ArrayRef<llvm::Value_*>)(auVar5 << 0x40),(Twine *)(lVar22 + -0x18),
                     in_stack_fffffffffffffec8);
          lVar20 = lVar20 + 0x10;
        } while (uVar13 << 4 != lVar20);
      }
      pFVar23 = *(Function **)(F + 0x50);
      pFVar15 = F + 0x48;
      puVar7 = (undefined1 *)
               local_a8.
               super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
               super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>.
               super_SmallVectorBase<unsigned_int>.BeginX;
      if (pFVar23 == pFVar15) {
        pFVar17 = (Function *)0x0;
      }
      else {
        do {
          pFVar14 = pFVar23 + -0x18;
          if (pFVar23 == (Function *)0x0) {
            pFVar14 = (Function *)0x0;
          }
          pFVar17 = *(Function **)(pFVar14 + 0x30);
        } while ((pFVar17 == pFVar14 + 0x28) &&
                (pFVar23 = *(Function **)(pFVar23 + 8), pFVar23 != pFVar15));
      }
      do {
        do {
          local_a8.super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
          super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>.
          super_SmallVectorBase<unsigned_int>.BeginX = puVar7;
          if (pFVar23 == pFVar15) {
            if (Tors != (GlobalVariable *)0x0) {
              llvm::GlobalVariable::removeFromParent();
            }
            if (Tors_00 != (GlobalVariable *)0x0) {
              llvm::GlobalVariable::removeFromParent();
            }
            (__return_storage_ptr__->PreservedIDs).super_SmallPtrSetImpl<void_*>.
            super_SmallPtrSetImplBase.SmallArray = (void **)0x0;
            (__return_storage_ptr__->PreservedIDs).super_SmallPtrSetImpl<void_*>.
            super_SmallPtrSetImplBase.CurArray = (void **)0x0;
            (__return_storage_ptr__->PreservedIDs).super_SmallPtrSetImpl<void_*>.
            super_SmallPtrSetImplBase.CurArraySize = 0;
            (__return_storage_ptr__->PreservedIDs).super_SmallPtrSetImpl<void_*>.
            super_SmallPtrSetImplBase.NumNonEmpty = 0;
            *(undefined8 *)
             &(__return_storage_ptr__->PreservedIDs).super_SmallPtrSetImpl<void_*>.
              super_SmallPtrSetImplBase.NumTombstones = 0;
            (__return_storage_ptr__->NotPreservedAnalysisIDs).
            super_SmallPtrSetImpl<llvm::AnalysisKey_*>.super_SmallPtrSetImplBase.SmallArray =
                 (void **)0x0;
            (__return_storage_ptr__->NotPreservedAnalysisIDs).
            super_SmallPtrSetImpl<llvm::AnalysisKey_*>.super_SmallPtrSetImplBase.CurArray =
                 (void **)0x0;
            (__return_storage_ptr__->NotPreservedAnalysisIDs).
            super_SmallPtrSetImpl<llvm::AnalysisKey_*>.super_SmallPtrSetImplBase.CurArraySize = 0;
            (__return_storage_ptr__->NotPreservedAnalysisIDs).
            super_SmallPtrSetImpl<llvm::AnalysisKey_*>.super_SmallPtrSetImplBase.NumNonEmpty = 0;
            *(undefined8 *)
             &(__return_storage_ptr__->NotPreservedAnalysisIDs).
              super_SmallPtrSetImpl<llvm::AnalysisKey_*>.super_SmallPtrSetImplBase.NumTombstones = 0
            ;
            (__return_storage_ptr__->NotPreservedAnalysisIDs).SmallStorage[0] = (void *)0x0;
            (__return_storage_ptr__->NotPreservedAnalysisIDs).SmallStorage[1] = (void *)0x0;
            (__return_storage_ptr__->PreservedIDs).SmallStorage[0] = (void *)0x0;
            (__return_storage_ptr__->PreservedIDs).SmallStorage[1] = (void *)0x0;
            ppvVar1 = (__return_storage_ptr__->NotPreservedAnalysisIDs).SmallStorage;
            ppvVar2 = (__return_storage_ptr__->PreservedIDs).SmallStorage;
            (__return_storage_ptr__->PreservedIDs).super_SmallPtrSetImpl<void_*>.
            super_SmallPtrSetImplBase.SmallArray = ppvVar2;
            (__return_storage_ptr__->PreservedIDs).super_SmallPtrSetImpl<void_*>.
            super_SmallPtrSetImplBase.CurArray = ppvVar2;
            (__return_storage_ptr__->PreservedIDs).super_SmallPtrSetImpl<void_*>.
            super_SmallPtrSetImplBase.CurArraySize = 2;
            (__return_storage_ptr__->PreservedIDs).super_SmallPtrSetImpl<void_*>.
            super_SmallPtrSetImplBase.NumNonEmpty = 0;
            (__return_storage_ptr__->PreservedIDs).super_SmallPtrSetImpl<void_*>.
            super_SmallPtrSetImplBase.NumTombstones = 0;
            (__return_storage_ptr__->NotPreservedAnalysisIDs).
            super_SmallPtrSetImpl<llvm::AnalysisKey_*>.super_SmallPtrSetImplBase.SmallArray =
                 ppvVar1;
            (__return_storage_ptr__->NotPreservedAnalysisIDs).
            super_SmallPtrSetImpl<llvm::AnalysisKey_*>.super_SmallPtrSetImplBase.CurArray = ppvVar1;
            (__return_storage_ptr__->NotPreservedAnalysisIDs).
            super_SmallPtrSetImpl<llvm::AnalysisKey_*>.super_SmallPtrSetImplBase.CurArraySize = 2;
            (__return_storage_ptr__->NotPreservedAnalysisIDs).
            super_SmallPtrSetImpl<llvm::AnalysisKey_*>.super_SmallPtrSetImplBase.NumNonEmpty = 0;
            (__return_storage_ptr__->NotPreservedAnalysisIDs).
            super_SmallPtrSetImpl<llvm::AnalysisKey_*>.super_SmallPtrSetImplBase.NumTombstones = 0;
            if ((undefined1 *)
                local_a8.
                super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
                super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>.
                super_SmallVectorBase<unsigned_int>.BeginX != local_98) {
              free(local_a8.
                   super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
                   super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>
                   .super_SmallVectorBase<unsigned_int>.BeginX);
            }
            if ((undefined1 *)
                local_f8.
                super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
                super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>.
                super_SmallVectorBase<unsigned_int>.BeginX == local_e8) {
              return __return_storage_ptr__;
            }
            free(local_f8.
                 super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
                 super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>.
                 super_SmallVectorBase<unsigned_int>.BeginX);
            return __return_storage_ptr__;
          }
          NameStr = (Twine *)(pFVar17 + -0x18);
          if (pFVar17 == (Function *)0x0) {
            NameStr = (Twine *)0x0;
          }
          if (((NameStr->RHS).character == '\x1c') &&
             (uVar13 = local_a8.
                       super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>
                       .
                       super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>
                       .super_SmallVectorBase<unsigned_int>._8_8_ & 0xffffffff, uVar13 != 0)) {
            lVar22 = 0;
            do {
              pFVar14 = *(Function **)(puVar7 + lVar22);
              if (pFVar14 == (Function *)0x0) {
                pFVar12 = (FunctionType *)0x0;
              }
              else {
                pFVar12 = llvm::Function::getFunctionType(pFVar14);
              }
              llvm::Twine::Twine(&local_58,"");
              auVar6._8_8_ = 0;
              auVar6._0_8_ = &local_58;
              llvm::CallInst::Create
                        ((CallInst *)pFVar12,(FunctionType *)pFVar14,(Value *)0x0,
                         (ArrayRef<llvm::Value_*>)(auVar6 << 0x40),NameStr,in_stack_fffffffffffffec8
                        );
              lVar22 = lVar22 + 0x10;
            } while (uVar13 << 4 != lVar22);
          }
          pFVar17 = *(Function **)(pFVar17 + 8);
          pFVar14 = pFVar23 + -0x18;
          if (pFVar23 == (Function *)0x0) {
            pFVar14 = (Function *)0x0;
          }
          puVar7 = (undefined1 *)
                   local_a8.
                   super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
                   super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>
                   .super_SmallVectorBase<unsigned_int>.BeginX;
        } while (pFVar17 != pFVar14 + 0x28);
        for (pFVar23 = *(Function **)(pFVar23 + 8); pFVar23 != pFVar15;
            pFVar23 = *(Function **)(pFVar23 + 8)) {
          pFVar14 = pFVar23 + -0x18;
          if (pFVar23 == (Function *)0x0) {
            pFVar14 = (Function *)0x0;
          }
          pFVar17 = *(Function **)(pFVar14 + 0x30);
          if (pFVar17 != pFVar14 + 0x28) break;
        }
      } while( true );
    }
  }
  llvm::PreservedAnalyses::all();
  return __return_storage_ptr__;
}

Assistant:

llvm::PreservedAnalyses InlineCtorsPass::run(Function &F,
                                             FunctionAnalysisManager &FM) {
  if (!F.hasFnAttribute("shellvm-main")) {

    return llvm::PreservedAnalyses::all();
  }

  GlobalVariable *GlobalCtors =
      F.getParent()->getNamedGlobal("llvm.global_ctors");
  GlobalVariable *GlobalDtors =
      F.getParent()->getNamedGlobal("llvm.global_dtors");
  if (!GlobalCtors && !GlobalDtors) {
    return llvm::PreservedAnalyses::all();
  }

  SmallVector<FunctionPair, 4> Ctors;
  getFunctions(GlobalCtors, Ctors);
  SmallVector<FunctionPair, 4> Dtors;
  getFunctions(GlobalDtors, Dtors);

  // Sort constructors in ascending order of priority
  std::sort(Ctors.begin(), Ctors.end(),
            [](const FunctionPair &A, const FunctionPair &B) -> bool {
              return A.second > B.second;
            });

  // Sort destructors in descending order of priority
  std::sort(Ctors.begin(), Ctors.end(),
            [](const FunctionPair &A, const FunctionPair &B) -> bool {
              return A.second < B.second;
            });

  {
    BasicBlock *BBEntry = &F.getEntryBlock();
    BasicBlock::iterator I = BBEntry->begin();
    // Place calls to constructors after alloca
    while (isa<AllocaInst>(I))
      ++I;

    for (auto &KV : Ctors) {
      CallInst::Create(KV.first, ArrayRef<Value *>(), "", &*I);
    }
  }

  // Search for ret instructions
  for (inst_iterator I = inst_begin(F), E = inst_end(F); I != E; ++I) {
    if (!isa<ReturnInst>(*I)) {
      continue;
    }

    for (auto &KV : Dtors) {
      CallInst::Create(KV.first, ArrayRef<Value *>(), "", &*I);
    }
  }

  // Delete llvm.global_ctors and llvm.global_dtors to prevent duplicate calls
  if (GlobalCtors)
    GlobalCtors->removeFromParent();
  if (GlobalDtors)
    GlobalDtors->removeFromParent();

  return llvm::PreservedAnalyses::none();
}